

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

int Abc_NtkEliminate1(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int nIterMax,int fReverse,
                     int fVerbose)

{
  int iVar1;
  int iVar2;
  char cVar3;
  
  if (0 < nIterMax) {
    do {
      iVar1 = pNtk->nObjCounts[7];
      iVar2 = Abc_NtkEliminate1One(pNtk,ElimValue,nMaxSize,fReverse,fVerbose);
      cVar3 = '\x01';
      if (iVar2 != 0) {
        cVar3 = (iVar1 == pNtk->nObjCounts[7]) * '\x02';
      }
      if (cVar3 != '\0') {
        if (cVar3 != '\x02') {
          return 0;
        }
        return 1;
      }
      nIterMax = nIterMax + -1;
    } while (nIterMax != 0);
  }
  return 1;
}

Assistant:

int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose )
{
    int i;
    for ( i = 0; i < nIterMax; i++ )
    {
        int nNodes = Abc_NtkNodeNum(pNtk);
//        printf( "%d ", nNodes );
        if ( !Abc_NtkEliminate1One(pNtk, ElimValue, nMaxSize, fReverse, fVerbose) )
            return 0;
        if ( nNodes == Abc_NtkNodeNum(pNtk) )
            break;
    }
    return 1;
}